

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log::Add(Log *this,string *prefix,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"[",prefix);
  std::operator+(&bStack_78,&local_38,"] ");
  std::operator+(&local_58,&bStack_78,message);
  Add(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Log::Add(string prefix, string message) {
  Add("[" + prefix + "] " + message);
}